

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_config.cc
# Opt level: O2

ssl_verify_result_t CustomVerifyCallback(SSL *ssl,uint8_t *out_alert)

{
  bool bVar1;
  ssl_verify_result_t sVar2;
  TestConfig *pTVar3;
  TestState *pTVar4;
  
  pTVar3 = GetTestConfig(ssl);
  bVar1 = CheckVerifyCallback(ssl);
  if (bVar1) {
    if ((pTVar3->async == true) && (pTVar4 = GetTestState(ssl), pTVar4->custom_verify_ready != true)
       ) {
      sVar2 = ssl_verify_retry;
    }
    else {
      pTVar4 = GetTestState(ssl);
      pTVar4->cert_verified = true;
      sVar2 = (ssl_verify_result_t)pTVar3->verify_fail;
    }
  }
  else {
    sVar2 = ssl_verify_invalid;
  }
  return sVar2;
}

Assistant:

static ssl_verify_result_t CustomVerifyCallback(SSL *ssl, uint8_t *out_alert) {
  const TestConfig *config = GetTestConfig(ssl);
  if (!CheckVerifyCallback(ssl)) {
    return ssl_verify_invalid;
  }

  if (config->async && !GetTestState(ssl)->custom_verify_ready) {
    return ssl_verify_retry;
  }

  GetTestState(ssl)->cert_verified = true;
  if (config->verify_fail) {
    return ssl_verify_invalid;
  }

  return ssl_verify_ok;
}